

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Quantize_x86_avx::forward(Quantize_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint elempack;
  int iVar1;
  uint _h;
  int *piVar2;
  Allocator *pAVar3;
  void *pvVar4;
  size_t sVar5;
  int iVar6;
  Mat *pMVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  int q;
  long lVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  ncnn *pnVar16;
  char *pcVar17;
  uint uVar18;
  uint _elempack;
  long lVar19;
  char *pcVar20;
  long lVar21;
  int _w;
  
  elempack = bottom_blob->elempack;
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  lVar12 = (long)(int)elempack;
  if (iVar1 == 3) {
    uVar18 = bottom_blob->c;
    bVar11 = (elempack * uVar18 & 7) == 0 & opt->use_packing_layout;
    sVar8 = 1;
    if (bVar11 != 0) {
      sVar8 = 8;
    }
    _elempack = (uint)sVar8;
    Mat::create(top_blob,_w,_h,(int)(elempack * uVar18) / (int)_elempack,sVar8,_elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((0 < (int)uVar18 && elempack == 4) && bVar11 == 0) {
      lVar19 = 3;
      uVar13 = 0;
      do {
        sVar8 = top_blob->cstep;
        pvVar4 = top_blob->data;
        sVar5 = top_blob->elemsize;
        pfVar15 = (float *)(sVar8 * (lVar19 + -3) * sVar5 + (long)pvVar4);
        pcVar10 = (char *)((lVar19 + -2) * sVar8 * sVar5 + (long)pvVar4);
        pcVar9 = (char *)((lVar19 + -1) * sVar8 * sVar5 + (long)pvVar4);
        pcVar17 = (char *)(sVar8 * lVar19 * sVar5 + (long)pvVar4);
        pcVar20 = (char *)(this->super_Quantize).scale_data.data;
        pnVar16 = (ncnn *)(bottom_blob->cstep * uVar13 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar2 = (this->super_Quantize).scale_data.refcount;
          pMVar7 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar2 == (int *)0x0) goto LAB_00445334;
          pAVar3 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
          quantize_pack4to1(pnVar16,pfVar15,pcVar10,pcVar9,pcVar17,pcVar20,pMVar7,_h * _w);
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pAVar3 == (Allocator *)0x0) {
              if (pcVar20 != (char *)0x0) {
                free(pcVar20);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])(pAVar3,pcVar20);
            }
          }
        }
        else {
          pcVar20 = pcVar20 + (lVar19 + -3) * (this->super_Quantize).scale_data.elemsize;
          pMVar7 = (Mat *)&DAT_00000004;
LAB_00445334:
          quantize_pack4to1(pnVar16,pfVar15,pcVar10,pcVar9,pcVar17,pcVar20,pMVar7,_h * _w);
        }
        uVar13 = uVar13 + 1;
        lVar19 = lVar19 + 4;
      } while (uVar18 != uVar13);
    }
    if ((int)uVar18 < 1 || elempack != _elempack) {
      return 0;
    }
    lVar19 = 0;
    uVar13 = 0;
    do {
      pnVar16 = (ncnn *)(bottom_blob->cstep * uVar13 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      pfVar15 = (float *)(top_blob->cstep * uVar13 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pcVar20 = (char *)(this->super_Quantize).scale_data.data;
        piVar2 = (this->super_Quantize).scale_data.refcount;
        pMVar7 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
        if (piVar2 == (int *)0x0) goto LAB_004450fc;
        pAVar3 = (this->super_Quantize).scale_data.allocator;
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
        quantize(pnVar16,pfVar15,pcVar20,pMVar7,_h * _w,elempack);
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pAVar3 == (Allocator *)0x0) {
            if (pcVar20 != (char *)0x0) {
              free(pcVar20);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])(pAVar3,pcVar20);
          }
        }
      }
      else {
        pcVar20 = (char *)((this->super_Quantize).scale_data.elemsize * lVar19 +
                          (long)(this->super_Quantize).scale_data.data);
        pMVar7 = (Mat *)(ulong)elempack;
LAB_004450fc:
        quantize(pnVar16,pfVar15,pcVar20,pMVar7,_h * _w,elempack);
      }
      uVar13 = uVar13 + 1;
      lVar19 = lVar19 + lVar12;
    } while (uVar18 != uVar13);
  }
  else if (iVar1 == 2) {
    bVar11 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    sVar8 = 1;
    if (bVar11 != 0) {
      sVar8 = 8;
    }
    uVar18 = (uint)sVar8;
    Mat::create(top_blob,_w,(int)(elempack * _h) / (int)uVar18,sVar8,uVar18,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((0 < (int)_h && elempack == 4) && bVar11 == 0) {
      lVar19 = 3;
      uVar13 = 0;
      do {
        pvVar4 = top_blob->data;
        lVar21 = (long)top_blob->w * top_blob->elemsize;
        pfVar15 = (float *)(lVar21 * (lVar19 + -3) + (long)pvVar4);
        pcVar10 = (char *)((lVar19 + -2) * lVar21 + (long)pvVar4);
        pcVar9 = (char *)((lVar19 + -1) * lVar21 + (long)pvVar4);
        pcVar17 = (char *)(lVar21 * lVar19 + (long)pvVar4);
        pcVar20 = (char *)(this->super_Quantize).scale_data.data;
        pnVar16 = (ncnn *)((long)bottom_blob->w * uVar13 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar2 = (this->super_Quantize).scale_data.refcount;
          pMVar7 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
          if (piVar2 == (int *)0x0) goto LAB_00445213;
          pAVar3 = (this->super_Quantize).scale_data.allocator;
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
          quantize_pack4to1(pnVar16,pfVar15,pcVar10,pcVar9,pcVar17,pcVar20,pMVar7,_w);
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pAVar3 == (Allocator *)0x0) {
              if (pcVar20 != (char *)0x0) {
                free(pcVar20);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])(pAVar3,pcVar20);
            }
          }
        }
        else {
          pcVar20 = pcVar20 + (lVar19 + -3) * (this->super_Quantize).scale_data.elemsize;
          pMVar7 = (Mat *)&DAT_00000004;
LAB_00445213:
          quantize_pack4to1(pnVar16,pfVar15,pcVar10,pcVar9,pcVar17,pcVar20,pMVar7,_w);
        }
        uVar13 = uVar13 + 1;
        lVar19 = lVar19 + 4;
      } while (_h != uVar13);
    }
    if ((int)_h < 1 || elempack != uVar18) {
      return 0;
    }
    lVar19 = 0;
    uVar13 = 0;
    do {
      pnVar16 = (ncnn *)((long)bottom_blob->w * uVar13 * bottom_blob->elemsize +
                        (long)bottom_blob->data);
      pfVar15 = (float *)((long)top_blob->w * uVar13 * top_blob->elemsize + (long)top_blob->data);
      if ((this->super_Quantize).scale_data_size < 2) {
        pcVar20 = (char *)(this->super_Quantize).scale_data.data;
        piVar2 = (this->super_Quantize).scale_data.refcount;
        pMVar7 = (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w;
        if (piVar2 == (int *)0x0) goto LAB_00444f57;
        pAVar3 = (this->super_Quantize).scale_data.allocator;
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
        quantize(pnVar16,pfVar15,pcVar20,pMVar7,_w,elempack);
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pAVar3 == (Allocator *)0x0) {
            if (pcVar20 != (char *)0x0) {
              free(pcVar20);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])(pAVar3,pcVar20);
          }
        }
      }
      else {
        pcVar20 = (char *)((this->super_Quantize).scale_data.elemsize * lVar19 +
                          (long)(this->super_Quantize).scale_data.data);
        pMVar7 = (Mat *)(ulong)elempack;
LAB_00444f57:
        quantize(pnVar16,pfVar15,pcVar20,pMVar7,_w,elempack);
      }
      uVar13 = uVar13 + 1;
      lVar19 = lVar19 + lVar12;
    } while (_h != uVar13);
  }
  else {
    if (iVar1 != 1) {
      return 0;
    }
    sVar8 = 8;
    if (opt->use_packing_layout == false) {
      sVar8 = 1;
    }
    if ((elempack * _w & 7) != 0) {
      sVar8 = 1;
    }
    Mat::create(top_blob,(int)(elempack * _w) / (int)sVar8,sVar8,(int)sVar8,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar13 = (long)_w / (long)opt->num_threads;
    uVar14 = 1;
    if (1 < (int)uVar13) {
      uVar14 = uVar13 & 0xffffffff;
    }
    iVar1 = (int)uVar14;
    uVar13 = (long)(_w + iVar1 + -1) / (long)iVar1;
    if ((int)uVar13 < 1) {
      return 0;
    }
    uVar13 = uVar13 & 0xffffffff;
    lVar19 = 0;
    lVar21 = 0;
    do {
      iVar6 = _w;
      if (iVar1 < _w) {
        iVar6 = iVar1;
      }
      _w = -(iVar1 - _w);
      quantize((ncnn *)((long)bottom_blob->data + lVar21),(float *)((long)top_blob->data + lVar19),
               (char *)(this->super_Quantize).scale_data.data,
               (Mat *)(ulong)(uint)(this->super_Quantize).scale_data.w,iVar6 * elempack,1);
      lVar21 = lVar21 + lVar12 * uVar14 * 4;
      lVar19 = lVar19 + lVar12 * uVar14;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  return 0;
}

Assistant:

int Quantize_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}